

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Option::Clear(Option *this)

{
  InternalMetadata *this_00;
  string *psVar1;
  Any *this_01;
  ulong uVar2;
  void *pvVar3;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  pvVar3 = this_00->ptr_;
  uVar2 = (ulong)pvVar3 & 1;
  if (uVar2 != 0) {
    pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  if ((pvVar3 == (void *)0x0) && (this_01 = this->value_, this_01 != (Any *)0x0)) {
    Any::~Any(this_01);
    operator_delete(this_01);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->value_ = (Any *)0x0;
  if (uVar2 != 0) {
    internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>(this_00);
    return;
  }
  return;
}

Assistant:

void Option::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Option)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  name_.ClearToEmpty(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  if (GetArena() == nullptr && value_ != nullptr) {
    delete value_;
  }
  value_ = nullptr;
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}